

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

UV_PREDICTION_MODE
read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,aom_reader *r,CFL_ALLOWED_TYPE cfl_allowed,
                  PREDICTION_MODE y_mode)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  byte bVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint16_t *icdf;
  ulong uVar7;
  uint nsyms;
  
  icdf = (uint16_t *)
         ((long)ec_ctx +
         (ulong)(uint)((int)CONCAT71(in_register_00000009,y_mode) << 5) +
         (CONCAT71(in_register_00000009,y_mode) & 0xffffffff) * -2 +
         (CONCAT71(in_register_00000011,cfl_allowed) & 0xffffffff) * 0x186 + 0x3226);
  iVar3 = -(uint)((int)CONCAT71(in_register_00000011,cfl_allowed) == 0);
  nsyms = iVar3 + 0xe;
  iVar5 = od_ec_decode_cdf_q15(&r->ec,icdf,nsyms);
  if (r->allow_update_cdf != '\0') {
    uVar1 = icdf[nsyms];
    bVar6 = (char)(uVar1 >> 4) + 5;
    uVar7 = 0;
    do {
      uVar2 = icdf[uVar7];
      if ((long)uVar7 < (long)(char)(UV_PREDICTION_MODE)iVar5) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
      }
      else {
        sVar4 = -(uVar2 >> (bVar6 & 0x1f));
      }
      icdf[uVar7] = sVar4 + uVar2;
      uVar7 = uVar7 + 1;
    } while (iVar3 + 0xd != uVar7);
    icdf[nsyms] = icdf[nsyms] + (ushort)(uVar1 < 0x20);
  }
  return (UV_PREDICTION_MODE)iVar5;
}

Assistant:

static UV_PREDICTION_MODE read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,
                                             aom_reader *r,
                                             CFL_ALLOWED_TYPE cfl_allowed,
                                             PREDICTION_MODE y_mode) {
  const UV_PREDICTION_MODE uv_mode =
      aom_read_symbol(r, ec_ctx->uv_mode_cdf[cfl_allowed][y_mode],
                      UV_INTRA_MODES - !cfl_allowed, ACCT_STR);
  return uv_mode;
}